

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataCollectionSegment::FetchChunk
          (ColumnDataCollectionSegment *this,idx_t chunk_idx,DataChunk *result)

{
  ulong local_50;
  vector<unsigned_long,_true> column_ids;
  
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (local_50 = 0;
      local_50 <
      (ulong)(((long)(this->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18); local_50 = local_50 + 1) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,&local_50);
  }
  FetchChunk(this,chunk_idx,result,&column_ids);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  return;
}

Assistant:

void ColumnDataCollectionSegment::FetchChunk(idx_t chunk_idx, DataChunk &result) {
	vector<column_t> column_ids;
	column_ids.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		column_ids.push_back(i);
	}
	FetchChunk(chunk_idx, result, column_ids);
}